

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeReleaseAllCursorPages(BtCursor *pCur)

{
  int local_14;
  int i;
  BtCursor *pCur_local;
  
  for (local_14 = 0; local_14 <= pCur->iPage; local_14 = local_14 + 1) {
    releasePage(pCur->apPage[local_14]);
    pCur->apPage[local_14] = (MemPage *)0x0;
  }
  pCur->iPage = -1;
  return;
}

Assistant:

static void btreeReleaseAllCursorPages(BtCursor *pCur){
  int i;
  for(i=0; i<=pCur->iPage; i++){
    releasePage(pCur->apPage[i]);
    pCur->apPage[i] = 0;
  }
  pCur->iPage = -1;
}